

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O0

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          Uint64 CompletedFenceValue)

{
  bool bVar1;
  reference pvVar2;
  value_type *FirstObj;
  lock_guard<std::mutex> LockGuard;
  Uint64 CompletedFenceValue_local;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_local;
  
  LockGuard._M_device = (mutex_type *)CompletedFenceValue;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&FirstObj,&this->m_ReleaseQueueMutex);
  while ((bVar1 = std::
                  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                  ::empty(&this->m_ReleaseQueue), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (pvVar2 = std::
                   deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                   ::front(&this->m_ReleaseQueue),
         (mutex_type *)pvVar2->first <= LockGuard._M_device))) {
    std::
    deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
    ::pop_front(&this->m_ReleaseQueue);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&FirstObj);
  return;
}

Assistant:

void Purge(Uint64 CompletedFenceValue)
    {
        std::lock_guard<std::mutex> LockGuard(m_ReleaseQueueMutex);

        // Release all objects whose associated fence value is at most CompletedFenceValue
        // See http://diligentgraphics.com/diligent-engine/architecture/d3d12/managing-resource-lifetimes/
        while (!m_ReleaseQueue.empty())
        {
            auto& FirstObj = m_ReleaseQueue.front();
            if (FirstObj.first <= CompletedFenceValue)
                m_ReleaseQueue.pop_front();
            else
                break;
        }
    }